

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_strifeweapons.cpp
# Opt level: O1

int AF_A_JabDagger(VMFrameStack *stack,VMValue *param,int numparam,VMReturn *ret,int numret)

{
  VM_UBYTE VVar1;
  AActor *this;
  undefined8 *puVar2;
  PClass *pPVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  undefined4 extraout_var;
  undefined8 uVar7;
  PClass *pPVar8;
  AInventory *pAVar9;
  VMValue *pVVar10;
  char *pcVar11;
  int iVar12;
  bool bVar13;
  FTranslatedLineTarget t;
  FSoundID local_78;
  FSoundID local_74;
  FName local_70;
  FName local_6c;
  undefined1 local_68 [32];
  FTranslatedLineTarget local_48;
  
  pPVar3 = AActor::RegistrationInfo.MyClass;
  if (numparam < 1) {
    pcVar11 = "(paramnum) < numparam";
    goto LAB_005d06f3;
  }
  if (((param->field_0).field_3.Type == '\x03') &&
     (((param->field_0).field_1.atag == 1 || ((param->field_0).field_1.a == (void *)0x0)))) {
    this = *(AActor **)&param->field_0;
    pVVar10 = param;
    uVar5 = numparam;
    if (this != (AActor *)0x0) {
      if ((this->super_DThinker).super_DObject.Class == (PClass *)0x0) {
        iVar4 = (**(this->super_DThinker).super_DObject._vptr_DObject)(this);
        (this->super_DThinker).super_DObject.Class = (PClass *)CONCAT44(extraout_var,iVar4);
      }
      pPVar8 = (this->super_DThinker).super_DObject.Class;
      bVar13 = pPVar8 == (PClass *)0x0;
      ret = (VMReturn *)(ulong)!bVar13;
      uVar5 = (uint)bVar13;
      pVVar10 = (VMValue *)(ulong)(pPVar8 == pPVar3 || bVar13);
      if (pPVar8 != pPVar3 && !bVar13) {
        do {
          pPVar8 = pPVar8->ParentClass;
          ret = (VMReturn *)(ulong)(pPVar8 != (PClass *)0x0);
          if (pPVar8 == pPVar3) break;
        } while (pPVar8 != (PClass *)0x0);
      }
      if ((char)ret == '\0') {
        pcVar11 = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
        goto LAB_005d06f3;
      }
    }
    pPVar3 = AActor::RegistrationInfo.MyClass;
    if ((numparam != 1) && (VVar1 = param[1].field_0.field_3.Type, VVar1 != 0xff)) {
      if ((VVar1 != '\x03') ||
         ((param[1].field_0.field_1.atag != 1 && (param[1].field_0.field_1.a != (void *)0x0))))
      goto LAB_005d06c8;
      puVar2 = (undefined8 *)param[1].field_0.field_1.a;
      if (puVar2 != (undefined8 *)0x0) {
        if (puVar2[1] == 0) {
          uVar7 = (**(code **)*puVar2)(puVar2,pVVar10,uVar5,ret);
          puVar2[1] = uVar7;
        }
        pPVar8 = (PClass *)puVar2[1];
        bVar13 = pPVar8 != (PClass *)0x0;
        if (pPVar8 != pPVar3 && bVar13) {
          do {
            pPVar8 = pPVar8->ParentClass;
            bVar13 = pPVar8 != (PClass *)0x0;
            if (pPVar8 == pPVar3) break;
          } while (pPVar8 != (PClass *)0x0);
        }
        if (!bVar13) {
          pcVar11 = "stateowner == NULL || stateowner->IsKindOf(RUNTIME_CLASS(AActor))";
          goto LAB_005d06f3;
        }
      }
    }
    if (((numparam < 3) || (VVar1 = param[2].field_0.field_3.Type, VVar1 == 0xff)) ||
       ((VVar1 == '\x03' &&
        ((param[2].field_0.field_1.atag == 8 || (param[2].field_0.field_1.a == (void *)0x0)))))) {
      iVar4 = (this->player->mo->super_AActor).stamina / 10;
      iVar12 = 10;
      if (iVar4 < 10) {
        iVar12 = iVar4;
      }
      uVar5 = FRandom::GenRand32(&pr_jabdagger);
      iVar12 = (iVar12 + 2) * (int)((long)(ulong)(uVar5 & 0xff) % (long)(iVar12 + 8));
      pAVar9 = AActor::FindInventory
                         (this,(PClassActor *)APowerStrength::RegistrationInfo.MyClass,false);
      iVar4 = iVar12 * 10;
      if (pAVar9 == (AInventory *)0x0) {
        iVar4 = iVar12;
      }
      uVar5 = FRandom::GenRand32(&pr_jabdagger);
      uVar6 = FRandom::GenRand32(&pr_jabdagger);
      pPVar3 = (PClass *)
               ((double)(int)((uVar5 & 0xff) - (uVar6 & 0xff)) * 0.02197265625 +
               (this->Angles).Yaw.Degrees);
      local_68._16_8_ = (DObject *)0x0;
      local_68._24_8_ = pPVar3;
      P_AimLineAttack((AActor *)local_68,(DAngle *)this,80.0,
                      (FTranslatedLineTarget *)(local_68 + 0x18),(DAngle *)0x0,(int)local_68 + 0x10,
                      (AActor *)0x0,(AActor *)0x0);
      local_6c.Index = 0x84;
      local_68._8_8_ = pPVar3;
      local_70.Index = FName::NameManager::FindName(&FName::NameData,"StrifeSpark",false);
      P_LineAttack(this,(DAngle *)(local_68 + 8),80.0,(DAngle *)local_68,iVar4,&local_6c,&local_70,1
                   ,&local_48,(int *)0x0);
      if (local_48.linetarget == (AActor *)0x0) {
        local_78.ID = S_FindSound("misc/swish");
        S_Sound(this,1,&local_78,1.0,1.0);
      }
      else {
        pcVar11 = "misc/metalhit";
        if ((((local_48.linetarget)->flags).Value >> 0x13 & 1) == 0) {
          pcVar11 = "misc/meathit";
        }
        local_74.ID = S_FindSound(pcVar11);
        S_Sound(this,1,&local_74,1.0,1.0);
        (this->Angles).Yaw.Degrees = local_48.angleFromSource.Degrees;
        *(byte *)&(this->flags).Value = (byte)(this->flags).Value | 0x80;
        P_DaggerAlert(this,local_48.linetarget);
      }
      return 0;
    }
    pcVar11 = 
    "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_STATEINFO || param[paramnum].a == NULL)"
    ;
  }
  else {
LAB_005d06c8:
    pcVar11 = 
    "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
    ;
  }
LAB_005d06f3:
  __assert_fail(pcVar11,
                "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_strife/a_strifeweapons.cpp"
                ,0x61,"int AF_A_JabDagger(VMFrameStack *, VMValue *, int, VMReturn *, int)");
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, A_JabDagger)
{
	PARAM_ACTION_PROLOGUE;

	DAngle 	angle;
	int 		damage;
	DAngle 		pitch;
	int			power;
	FTranslatedLineTarget t;

	power = MIN(10, self->player->mo->stamina / 10);
	damage = (pr_jabdagger() % (power + 8)) * (power + 2);

	if (self->FindInventory<APowerStrength>())
	{
		damage *= 10;
	}

	angle = self->Angles.Yaw + pr_jabdagger.Random2() * (5.625 / 256);
	pitch = P_AimLineAttack (self, angle, 80.);
	P_LineAttack (self, angle, 80., pitch, damage, NAME_Melee, "StrifeSpark", true, &t);

	// turn to face target
	if (t.linetarget)
	{
		S_Sound (self, CHAN_WEAPON,
			t.linetarget->flags & MF_NOBLOOD ? "misc/metalhit" : "misc/meathit",
			1, ATTN_NORM);
		self->Angles.Yaw = t.angleFromSource;
		self->flags |= MF_JUSTATTACKED;
		P_DaggerAlert (self, t.linetarget);
	}
	else
	{
		S_Sound (self, CHAN_WEAPON, "misc/swish", 1, ATTN_NORM);
	}
	return 0;
}